

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O3

void __thiscall ThreadedReplayer::~ThreadedReplayer(ThreadedReplayer *this)

{
  _Hash_node_base *p_Var1;
  VulkanDevice *pVVar2;
  void *pvVar3;
  DatabaseInterface *pDVar4;
  pointer pPVar5;
  long lVar6;
  anon_class_8_1_8991fb9c local_38;
  
  (this->super_StateCreatorInterface)._vptr_StateCreatorInterface =
       (_func_int **)&PTR__ThreadedReplayer_002ac2d0;
  tear_down_threads(this);
  flush_pipeline_cache(this);
  flush_validation_cache(this);
  for (p_Var1 = (this->samplers)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    if ((VkSampler)p_Var1[2]._M_nxt != (VkSampler)0x0) {
      (*vkDestroySampler)(((this->device)._M_t.
                           super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                           .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                          device,(VkSampler)p_Var1[2]._M_nxt,(VkAllocationCallbacks *)0x0);
    }
  }
  for (p_Var1 = (this->layouts)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    if ((VkDescriptorSetLayout)p_Var1[2]._M_nxt != (VkDescriptorSetLayout)0x0) {
      (*vkDestroyDescriptorSetLayout)
                (((this->device)._M_t.
                  super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                  .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->device,
                 (VkDescriptorSetLayout)p_Var1[2]._M_nxt,(VkAllocationCallbacks *)0x0);
    }
  }
  for (p_Var1 = (this->pipeline_layouts)._M_h._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    if ((VkPipelineLayout)p_Var1[2]._M_nxt != (VkPipelineLayout)0x0) {
      (*vkDestroyPipelineLayout)
                (((this->device)._M_t.
                  super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                  .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->device,
                 (VkPipelineLayout)p_Var1[2]._M_nxt,(VkAllocationCallbacks *)0x0);
    }
  }
  for (p_Var1 = (this->render_passes)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    if ((VkRenderPass)p_Var1[2]._M_nxt != (VkRenderPass)0x0) {
      (*vkDestroyRenderPass)
                (((this->device)._M_t.
                  super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                  .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->device,
                 (VkRenderPass)p_Var1[2]._M_nxt,(VkAllocationCallbacks *)0x0);
    }
  }
  free_pipelines(this);
  local_38.this = this;
  ::Fossilize::ObjectCache<VkShaderModule_T*>::
  delete_cache<ThreadedReplayer::~ThreadedReplayer()::_lambda(unsigned_long,VkShaderModule_T*)_1_>
            ((ObjectCache<VkShaderModule_T*> *)&this->shader_modules,&local_38);
  pVVar2 = (this->device)._M_t.
           super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
           .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl;
  if (pVVar2 != (VulkanDevice *)0x0) {
    (**(code **)(*(long *)pVVar2 + 8))();
  }
  (this->device)._M_t.
  super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>._M_t
  .super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>.
  super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl = (VulkanDevice *)0x0;
  lVar6 = 0;
  do {
    pvVar3 = *(void **)((long)&this->deferred_raytracing[3].
                               super__Vector_base<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar6);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)((long)&this->deferred_raytracing[3].
                                              super__Vector_base<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar6) - (long)pvVar3);
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x60);
  lVar6 = 0;
  do {
    pvVar3 = *(void **)((long)&this->deferred_compute[3].
                               super__Vector_base<ThreadedReplayer::DeferredComputeInfo,_std::allocator<ThreadedReplayer::DeferredComputeInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar6);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)((long)&this->deferred_compute[3].
                                              super__Vector_base<ThreadedReplayer::DeferredComputeInfo,_std::allocator<ThreadedReplayer::DeferredComputeInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar6) - (long)pvVar3);
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x60);
  lVar6 = 0;
  do {
    pvVar3 = *(void **)((long)&this->deferred_graphics[3].
                               super__Vector_base<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar6);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)((long)&this->deferred_graphics[3].
                                              super__Vector_base<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar6) - (long)pvVar3);
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x60);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredRayTracingInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredRayTracingInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->raytracing_parents)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->compute_parents)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->graphics_parents)._M_h);
  lVar6 = 0;
  do {
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)((long)&this->cached_blobs[9]._M_h._M_buckets + lVar6));
    lVar6 = lVar6 + -0x38;
  } while (lVar6 != -0x230);
  pDVar4 = (this->replayer_cache_db)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if (pDVar4 != (DatabaseInterface *)0x0) {
    (*pDVar4->_vptr_DatabaseInterface[1])();
  }
  (this->replayer_cache_db)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  pDVar4 = (this->module_identifier_db)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if (pDVar4 != (DatabaseInterface *)0x0) {
    (*pDVar4->_vptr_DatabaseInterface[1])();
  }
  (this->module_identifier_db)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  lVar6 = 0;
  do {
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)((long)&this->implicit_whitelist[9]._M_h._M_buckets + lVar6));
    lVar6 = lVar6 + -0x38;
  } while (lVar6 != -0x230);
  pDVar4 = (this->validation_blacklist_db)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if (pDVar4 != (DatabaseInterface *)0x0) {
    (*pDVar4->_vptr_DatabaseInterface[1])();
  }
  (this->validation_blacklist_db)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  pDVar4 = (this->validation_whitelist_db)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if (pDVar4 != (DatabaseInterface *)0x0) {
    (*pDVar4->_vptr_DatabaseInterface[1])();
  }
  (this->validation_whitelist_db)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  pDVar4 = (this->pipeline_stats_db)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if (pDVar4 != (DatabaseInterface *)0x0) {
    (*pDVar4->_vptr_DatabaseInterface[1])();
  }
  (this->pipeline_stats_db)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  std::_Deque_base<PipelineWorkItem,_std::allocator<PipelineWorkItem>_>::~_Deque_base
            ((_Deque_base<PipelineWorkItem,_std::allocator<PipelineWorkItem>_> *)
             &this->pipeline_work_queue);
  pPVar5 = (this->per_thread_data).
           super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar5 != (pointer)0x0) {
    operator_delete(pPVar5,(long)(this->per_thread_data).
                                 super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar5);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->thread_pool);
  lVar6 = 0;
  do {
    std::condition_variable::~condition_variable((condition_variable *)(&this->field_0x530 + lVar6))
    ;
    lVar6 = lVar6 + -0x30;
  } while (lVar6 != -0xc0);
  std::condition_variable::~condition_variable(&this->work_available_condition);
  std::
  _Hashtable<VkShaderModule_T_*,_VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>,_std::__detail::_Identity,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->enqueued_shader_modules)._M_h);
  std::
  _Hashtable<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->shader_module_to_hash)._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->masked_shader_modules)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->raytracing_pipelines)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->graphics_pipelines)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->compute_pipelines)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkRenderPass_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->render_passes)._M_h);
  ::Fossilize::ObjectCache<VkShaderModule_T_*>::~ObjectCache(&this->shader_modules);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->pipeline_layouts)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->layouts)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->samplers)._M_h);
  Options::~Options(&this->opts);
  return;
}

Assistant:

~ThreadedReplayer()
	{
		tear_down_threads();
		flush_pipeline_cache();
		flush_validation_cache();

		for (auto &sampler : samplers)
			if (sampler.second)
				vkDestroySampler(device->get_device(), sampler.second, nullptr);
		for (auto &layout : layouts)
			if (layout.second)
				vkDestroyDescriptorSetLayout(device->get_device(), layout.second, nullptr);
		for (auto &pipeline_layout : pipeline_layouts)
			if (pipeline_layout.second)
				vkDestroyPipelineLayout(device->get_device(), pipeline_layout.second, nullptr);
		for (auto &render_pass : render_passes)
			if (render_pass.second)
				vkDestroyRenderPass(device->get_device(), render_pass.second, nullptr);

		free_pipelines();

		shader_modules.delete_cache([this](Hash, VkShaderModule module) {
			if (module != VK_NULL_HANDLE)
				vkDestroyShaderModule(device->get_device(), module, nullptr);
		});
	}